

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O0

void TxToUniv(CTransaction *tx,uint256 *block_hash,UniValue *entry,bool include_hex,CTxUndo *txundo,
             TxVerbosity verbosity)

{
  long lVar1;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  bool bVar2;
  int32_t iVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  CScript *script;
  CScript *pCVar7;
  const_reference pvVar8;
  long in_FS_OFFSET;
  bool bVar9;
  CTransaction *in_stack_ffffffffffffe8d8;
  UniValue *in_stack_ffffffffffffe8e0;
  CTransaction *in_stack_ffffffffffffe8e8;
  UniValue *in_stack_ffffffffffffe8f0;
  UniValue *in_stack_ffffffffffffe8f8;
  undefined7 in_stack_ffffffffffffe908;
  undefined1 in_stack_ffffffffffffe90f;
  CTransaction *in_stack_ffffffffffffe910;
  UniValue *in_stack_ffffffffffffe918;
  undefined7 in_stack_ffffffffffffe920;
  undefined1 in_stack_ffffffffffffe927;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *in_stack_ffffffffffffe930;
  UniValue *pUVar10;
  bool *in_stack_ffffffffffffe938;
  allocator<char> *val;
  CScript *in_stack_ffffffffffffe940;
  SigningProvider *in_stack_ffffffffffffe960;
  SigningProvider *provider;
  undefined6 in_stack_ffffffffffffe968;
  undefined1 in_stack_ffffffffffffe96e;
  undefined1 include_address;
  undefined1 in_stack_ffffffffffffe96f;
  undefined1 include_hex_00;
  UniValue *in_stack_ffffffffffffe970;
  CScript *in_stack_ffffffffffffe978;
  CTxOut *txout;
  uint i_1;
  CTxOut *prev_txout;
  Coin *prev_coin;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *item;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range3;
  CTxIn *txin;
  uint i;
  CAmount amt_total_out;
  CAmount amt_total_in;
  bool have_undo;
  TxVerbosity verbosity_local;
  CTxUndo *txundo_local;
  bool include_hex_local;
  UniValue *entry_local;
  uint256 *block_hash_local;
  CTransaction *tx_local;
  allocator<char> local_145c;
  allocator<char> local_145b;
  undefined1 local_145a [2];
  CAmount fee;
  allocator<char> local_144a;
  allocator<char> local_1449;
  ulong local_1448;
  undefined1 local_143b [15];
  allocator<char> local_142c;
  allocator<char> local_142b;
  allocator<char> local_142a;
  allocator<char> local_1429;
  ulong local_1428;
  allocator<char> local_141c;
  byte local_141b;
  allocator<char> local_141a;
  allocator<char> local_1419 [17];
  const_iterator __end3;
  const_iterator __begin3;
  allocator<char> local_13f1 [23];
  allocator<char> local_13da;
  allocator<char> local_13d9;
  ulong local_13d8;
  allocator<char> local_13ca;
  allocator<char> local_13c9 [24];
  allocator<char> local_13b1;
  ulong local_13b0;
  allocator<char> local_13a5;
  int32_t local_13a4;
  allocator<char> local_139d;
  int local_139c;
  allocator<char> local_1395;
  uint local_1394;
  allocator<char> local_138d;
  allocator<char> local_138c;
  allocator<char> local_138b;
  allocator<char> local_138a;
  undefined1 local_1389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e0 [11];
  UniValue o_1;
  undefined1 local_f30 [32];
  UniValue out;
  UniValue vout;
  UniValue p;
  UniValue o_script_pub_key;
  UniValue txinwitness;
  UniValue o;
  UniValue in;
  UniValue vin;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1389 = 0 < (int)verbosity;
  inline_check_non_fatal<bool>
            (in_stack_ffffffffffffe938,in_stack_ffffffffffffe930,
             (int)((ulong)in_stack_ffffffffffffe928 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (char *)in_stack_ffffffffffffe918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  CTransaction::GetHash(in_stack_ffffffffffffe8d8);
  transaction_identifier<false>::GetHex_abi_cxx11_
            ((transaction_identifier<false> *)in_stack_ffffffffffffe8e0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffe918,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe910);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_138a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  CTransaction::GetWitnessHash(in_stack_ffffffffffffe8d8);
  transaction_identifier<true>::GetHex_abi_cxx11_
            ((transaction_identifier<true> *)in_stack_ffffffffffffe8e0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffe918,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe910);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_138b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>
            (in_stack_ffffffffffffe918,(uint *)in_stack_ffffffffffffe910);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_138c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  local_1394 = CTransaction::GetTotalSize(in_stack_ffffffffffffe8d8);
  UniValue::UniValue<unsigned_int,_unsigned_int,_true>
            (in_stack_ffffffffffffe918,(uint *)in_stack_ffffffffffffe910);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_138d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  iVar3 = GetTransactionWeight(in_stack_ffffffffffffe8d8);
  local_139c = iVar3 + 3;
  if (iVar3 + 3 < 0) {
    local_139c = iVar3 + 6;
  }
  local_139c = local_139c >> 2;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe918,(int *)in_stack_ffffffffffffe910);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_1395);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  local_13a4 = GetTransactionWeight(in_stack_ffffffffffffe8d8);
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe918,(int *)in_stack_ffffffffffffe910);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_139d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  local_13b0 = (ulong)tx->nLockTime;
  UniValue::UniValue<long,_long,_true>(in_stack_ffffffffffffe918,(long *)in_stack_ffffffffffffe910);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_13a5);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f0);
  UniValue::UniValue(in_stack_ffffffffffffe8f8,(VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),
                     (string *)in_stack_ffffffffffffe8e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  bVar9 = txundo != (CTxUndo *)0x0;
  amt_total_in = 0;
  amt_total_out = 0;
  for (i = 0; sVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                                (&in_stack_ffffffffffffe8d8->vin), i < sVar4; i = i + 1) {
    pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       (&in_stack_ffffffffffffe8e8->vin,(size_type)in_stack_ffffffffffffe8e0);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8f0);
    UniValue::UniValue(in_stack_ffffffffffffe8f8,(VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),
                       (string *)in_stack_ffffffffffffe8e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    bVar2 = CTransaction::IsCoinBase(in_stack_ffffffffffffe8e8);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe928,
                 (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                 (allocator<char> *)in_stack_ffffffffffffe918);
      Span<const_unsigned_char>::Span<CScript>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffe8e8,
                 (CScript *)in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8);
      s.m_size._0_6_ = in_stack_ffffffffffffe968;
      s.m_data = (uchar *)in_stack_ffffffffffffe960;
      s.m_size._6_1_ = in_stack_ffffffffffffe96e;
      s.m_size._7_1_ = in_stack_ffffffffffffe96f;
      HexStr_abi_cxx11_(s);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_ffffffffffffe918,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe910);
      UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                       (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::~allocator(&local_13b1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe928,
                 (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                 (allocator<char> *)in_stack_ffffffffffffe918);
      transaction_identifier<false>::GetHex_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_ffffffffffffe8e0);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_ffffffffffffe918,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe910);
      UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                       (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::~allocator(local_13c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe928,
                 (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                 (allocator<char> *)in_stack_ffffffffffffe918);
      local_13d8 = (ulong)(pvVar5->prevout).n;
      UniValue::UniValue<long,_long,_true>
                (in_stack_ffffffffffffe918,(long *)in_stack_ffffffffffffe910);
      UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                       (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::~allocator(&local_13ca);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8f0);
      UniValue::UniValue(in_stack_ffffffffffffe8f8,(VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20)
                         ,(string *)in_stack_ffffffffffffe8e8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe928,
                 (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                 (allocator<char> *)in_stack_ffffffffffffe918);
      ScriptToAsmStr_abi_cxx11_
                (in_stack_ffffffffffffe940,SUB81((ulong)in_stack_ffffffffffffe938 >> 0x38,0));
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_ffffffffffffe918,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe910);
      UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                       (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::~allocator(&local_13d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe928,
                 (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                 (allocator<char> *)in_stack_ffffffffffffe918);
      Span<const_unsigned_char>::Span<CScript>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffe8e8,
                 (CScript *)in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8);
      s_00.m_size._0_6_ = in_stack_ffffffffffffe968;
      s_00.m_data = (uchar *)in_stack_ffffffffffffe960;
      s_00.m_size._6_1_ = in_stack_ffffffffffffe96e;
      s_00.m_size._7_1_ = in_stack_ffffffffffffe96f;
      HexStr_abi_cxx11_(s_00);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_ffffffffffffe918,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe910);
      UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                       (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::~allocator(&local_13da);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe928,
                 (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                 (allocator<char> *)in_stack_ffffffffffffe918);
      UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
      UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                       (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::~allocator(local_13f1);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    }
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              (&in_stack_ffffffffffffe8e8->vin,(size_type)in_stack_ffffffffffffe8e0);
    bVar2 = CScriptWitness::IsNull((CScriptWitness *)in_stack_ffffffffffffe8d8);
    if (!bVar2) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8f0);
      UniValue::UniValue(in_stack_ffffffffffffe8f8,(VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20)
                         ,(string *)in_stack_ffffffffffffe8e8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                (&in_stack_ffffffffffffe8e8->vin,(size_type)in_stack_ffffffffffffe8e0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::begin((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)in_stack_ffffffffffffe8e0);
      __end3 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::end((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_ffffffffffffe8e0);
      while (bVar2 = __gnu_cxx::
                     operator==<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               ((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)in_stack_ffffffffffffe8e8,
                                (__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)in_stack_ffffffffffffe8e0), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator*((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)in_stack_ffffffffffffe8d8);
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_ffffffffffffe8e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8);
        s_01.m_size._0_6_ = in_stack_ffffffffffffe968;
        s_01.m_data = (uchar *)in_stack_ffffffffffffe960;
        s_01.m_size._6_1_ = in_stack_ffffffffffffe96e;
        s_01.m_size._7_1_ = in_stack_ffffffffffffe96f;
        HexStr_abi_cxx11_(s_01);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (in_stack_ffffffffffffe918,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe910);
        UniValue::push_back(in_stack_ffffffffffffe8f0,(UniValue *)in_stack_ffffffffffffe8e8);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        __gnu_cxx::
        __normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_ffffffffffffe8d8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe928,
                 (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                 (allocator<char> *)in_stack_ffffffffffffe918);
      UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
      UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                       (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe8d8);
      std::allocator<char>::~allocator(local_1419);
      UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    }
    if (bVar9) {
      pvVar6 = std::vector<Coin,_std::allocator<Coin>_>::operator[]
                         ((vector<Coin,_std::allocator<Coin>_> *)in_stack_ffffffffffffe8e8,
                          (size_type)in_stack_ffffffffffffe8e0);
      amt_total_in = (pvVar6->out).nValue + amt_total_in;
      if (verbosity == SHOW_DETAILS_AND_PREVOUT) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8f0);
        UniValue::UniValue(in_stack_ffffffffffffe8f8,
                           (VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),
                           (string *)in_stack_ffffffffffffe8e8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        ScriptToUniv(in_stack_ffffffffffffe978,in_stack_ffffffffffffe970,
                     (bool)in_stack_ffffffffffffe96f,(bool)in_stack_ffffffffffffe96e,
                     in_stack_ffffffffffffe960);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8f0);
        UniValue::UniValue(in_stack_ffffffffffffe8f8,
                           (VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),
                           (string *)in_stack_ffffffffffffe8e8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe928,
                   (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (allocator<char> *)in_stack_ffffffffffffe918);
        local_141b = pvVar6->field_0x28 & 1;
        UniValue::UniValue<bool,_bool,_true>
                  (in_stack_ffffffffffffe918,(bool *)in_stack_ffffffffffffe910);
        UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                         (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        std::allocator<char>::~allocator(&local_141a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe928,
                   (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (allocator<char> *)in_stack_ffffffffffffe918);
        local_1428 = (ulong)(*(uint *)&pvVar6->field_0x28 >> 1);
        UniValue::UniValue<unsigned_long,_unsigned_long,_true>
                  (in_stack_ffffffffffffe918,(unsigned_long *)in_stack_ffffffffffffe910);
        UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                         (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        std::allocator<char>::~allocator(&local_141c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe928,
                   (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (allocator<char> *)in_stack_ffffffffffffe918);
        ValueFromAmount(CONCAT17(in_stack_ffffffffffffe90f,in_stack_ffffffffffffe908));
        UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                         (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        std::allocator<char>::~allocator(&local_1429);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe928,
                   (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (allocator<char> *)in_stack_ffffffffffffe918);
        UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
        UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                         (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        std::allocator<char>::~allocator(&local_142a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe928,
                   (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (allocator<char> *)in_stack_ffffffffffffe918);
        UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
        UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                         (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe8d8);
        std::allocator<char>::~allocator(&local_142b);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
        UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe928,
               (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (allocator<char> *)in_stack_ffffffffffffe918);
    local_143b._3_8_ = ZEXT48(pvVar5->nSequence);
    UniValue::UniValue<long,_long,_true>
              (in_stack_ffffffffffffe918,(long *)in_stack_ffffffffffffe910);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                     (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::allocator<char>::~allocator(&local_142c);
    UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
    UniValue::push_back(in_stack_ffffffffffffe8f0,(UniValue *)in_stack_ffffffffffffe8e8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_143b + 2));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8f0);
  UniValue::UniValue(in_stack_ffffffffffffe8f8,(VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),
                     (string *)in_stack_ffffffffffffe8e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  i_1 = 0;
  while( true ) {
    script = (CScript *)(ulong)i_1;
    pCVar7 = (CScript *)
             std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe8d8);
    if (pCVar7 <= script) break;
    pvVar8 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffe8e8,
                        (size_type)in_stack_ffffffffffffe8e0);
    pUVar10 = (UniValue *)local_f30;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8f0);
    UniValue::UniValue(in_stack_ffffffffffffe8f8,(VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),
                       (string *)in_stack_ffffffffffffe8e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    include_address = (undefined1)((ulong)(local_143b + 1) >> 0x30);
    include_hex_00 = (undefined1)((ulong)(local_143b + 1) >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe928,
               (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (allocator<char> *)in_stack_ffffffffffffe918);
    ValueFromAmount(CONCAT17(in_stack_ffffffffffffe90f,in_stack_ffffffffffffe908));
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                     (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::allocator<char>::~allocator((allocator<char> *)(local_143b + 1));
    provider = (SigningProvider *)local_143b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe928,
               (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (allocator<char> *)in_stack_ffffffffffffe918);
    local_1448 = (ulong)i_1;
    UniValue::UniValue<long,_long,_true>
              (in_stack_ffffffffffffe918,(long *)in_stack_ffffffffffffe910);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                     (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::allocator<char>::~allocator((allocator<char> *)local_143b);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8f0);
    UniValue::UniValue(in_stack_ffffffffffffe8f8,(VType)((ulong)in_stack_ffffffffffffe8f0 >> 0x20),
                       (string *)in_stack_ffffffffffffe8e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    ScriptToUniv(script,pUVar10,(bool)include_hex_00,(bool)include_address,provider);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe928,
               (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (allocator<char> *)in_stack_ffffffffffffe918);
    UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                     (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::allocator<char>::~allocator(&local_1449);
    UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
    UniValue::push_back(in_stack_ffffffffffffe8f0,(UniValue *)in_stack_ffffffffffffe8e8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    if (bVar9) {
      amt_total_out = pvVar8->nValue + amt_total_out;
    }
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    i_1 = i_1 + 1;
  }
  val = &local_144a;
  pUVar10 = entry;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe928,
             (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
             (allocator<char> *)in_stack_ffffffffffffe918);
  this = local_11e0;
  UniValue::UniValue((UniValue *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e0);
  UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                   (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe8d8);
  std::allocator<char>::~allocator(&local_144a);
  if (bVar9) {
    fee = amt_total_in - amt_total_out;
    in_stack_ffffffffffffe927 = MoneyRange((CAmount *)in_stack_ffffffffffffe8d8);
    local_145a[1] = in_stack_ffffffffffffe927;
    inline_check_non_fatal<bool>
              ((bool *)val,(char *)pUVar10,(int)((ulong)this >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (char *)in_stack_ffffffffffffe918);
    in_stack_ffffffffffffe918 = (UniValue *)local_145a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (allocator<char> *)in_stack_ffffffffffffe918);
    ValueFromAmount(CONCAT17(in_stack_ffffffffffffe90f,in_stack_ffffffffffffe908));
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                     (string *)in_stack_ffffffffffffe918,entry);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::allocator<char>::~allocator((allocator<char> *)local_145a);
    in_stack_ffffffffffffe910 = (CTransaction *)entry;
  }
  bVar9 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_ffffffffffffe8e8);
  if (!bVar9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (allocator<char> *)in_stack_ffffffffffffe918);
    base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffe8f0);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_ffffffffffffe918,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe910);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                     (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::allocator<char>::~allocator(&local_145b);
  }
  if (include_hex) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
               (allocator<char> *)in_stack_ffffffffffffe918);
    EncodeHexTx_abi_cxx11_(in_stack_ffffffffffffe910);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_ffffffffffffe918,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe910);
    UniValue::pushKV((UniValue *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920),
                     (string *)in_stack_ffffffffffffe918,(UniValue *)in_stack_ffffffffffffe910);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe8d8);
    std::allocator<char>::~allocator(&local_145c);
  }
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffe8d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxToUniv(const CTransaction& tx, const uint256& block_hash, UniValue& entry, bool include_hex, const CTxUndo* txundo, TxVerbosity verbosity)
{
    CHECK_NONFATAL(verbosity >= TxVerbosity::SHOW_DETAILS);

    entry.pushKV("txid", tx.GetHash().GetHex());
    entry.pushKV("hash", tx.GetWitnessHash().GetHex());
    entry.pushKV("version", tx.version);
    entry.pushKV("size", tx.GetTotalSize());
    entry.pushKV("vsize", (GetTransactionWeight(tx) + WITNESS_SCALE_FACTOR - 1) / WITNESS_SCALE_FACTOR);
    entry.pushKV("weight", GetTransactionWeight(tx));
    entry.pushKV("locktime", (int64_t)tx.nLockTime);

    UniValue vin{UniValue::VARR};

    // If available, use Undo data to calculate the fee. Note that txundo == nullptr
    // for coinbase transactions and for transactions where undo data is unavailable.
    const bool have_undo = txundo != nullptr;
    CAmount amt_total_in = 0;
    CAmount amt_total_out = 0;

    for (unsigned int i = 0; i < tx.vin.size(); i++) {
        const CTxIn& txin = tx.vin[i];
        UniValue in(UniValue::VOBJ);
        if (tx.IsCoinBase()) {
            in.pushKV("coinbase", HexStr(txin.scriptSig));
        } else {
            in.pushKV("txid", txin.prevout.hash.GetHex());
            in.pushKV("vout", (int64_t)txin.prevout.n);
            UniValue o(UniValue::VOBJ);
            o.pushKV("asm", ScriptToAsmStr(txin.scriptSig, true));
            o.pushKV("hex", HexStr(txin.scriptSig));
            in.pushKV("scriptSig", std::move(o));
        }
        if (!tx.vin[i].scriptWitness.IsNull()) {
            UniValue txinwitness(UniValue::VARR);
            for (const auto& item : tx.vin[i].scriptWitness.stack) {
                txinwitness.push_back(HexStr(item));
            }
            in.pushKV("txinwitness", std::move(txinwitness));
        }
        if (have_undo) {
            const Coin& prev_coin = txundo->vprevout[i];
            const CTxOut& prev_txout = prev_coin.out;

            amt_total_in += prev_txout.nValue;

            if (verbosity == TxVerbosity::SHOW_DETAILS_AND_PREVOUT) {
                UniValue o_script_pub_key(UniValue::VOBJ);
                ScriptToUniv(prev_txout.scriptPubKey, /*out=*/o_script_pub_key, /*include_hex=*/true, /*include_address=*/true);

                UniValue p(UniValue::VOBJ);
                p.pushKV("generated", bool(prev_coin.fCoinBase));
                p.pushKV("height", uint64_t(prev_coin.nHeight));
                p.pushKV("value", ValueFromAmount(prev_txout.nValue));
                p.pushKV("scriptPubKey", std::move(o_script_pub_key));
                in.pushKV("prevout", std::move(p));
            }
        }
        in.pushKV("sequence", (int64_t)txin.nSequence);
        vin.push_back(std::move(in));
    }
    entry.pushKV("vin", std::move(vin));

    UniValue vout(UniValue::VARR);
    for (unsigned int i = 0; i < tx.vout.size(); i++) {
        const CTxOut& txout = tx.vout[i];

        UniValue out(UniValue::VOBJ);

        out.pushKV("value", ValueFromAmount(txout.nValue));
        out.pushKV("n", (int64_t)i);

        UniValue o(UniValue::VOBJ);
        ScriptToUniv(txout.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
        out.pushKV("scriptPubKey", std::move(o));
        vout.push_back(std::move(out));

        if (have_undo) {
            amt_total_out += txout.nValue;
        }
    }
    entry.pushKV("vout", std::move(vout));

    if (have_undo) {
        const CAmount fee = amt_total_in - amt_total_out;
        CHECK_NONFATAL(MoneyRange(fee));
        entry.pushKV("fee", ValueFromAmount(fee));
    }

    if (!block_hash.IsNull()) {
        entry.pushKV("blockhash", block_hash.GetHex());
    }

    if (include_hex) {
        entry.pushKV("hex", EncodeHexTx(tx)); // The hex-encoded transaction. Used the name "hex" to be consistent with the verbose output of "getrawtransaction".
    }
}